

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O2

void __thiscall
ScenePreprocessorTest_testAnimationPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testAnimationPreprocessingPos_Test *this)

{
  undefined8 *puVar1;
  double dVar2;
  aiNodeAnim *paVar3;
  int iVar4;
  aiAnimation *anim;
  aiVectorKey *paVar5;
  long lVar6;
  char *message;
  char *in_R9;
  float fVar7;
  AssertHelper in_stack_ffffffffffffffa8;
  AssertHelper in_stack_ffffffffffffffb0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  
  anim = MakeDummyAnimation();
  paVar3 = *anim->mChannels;
  paVar3->mNumScalingKeys = 10;
  paVar5 = (aiVectorKey *)operator_new__(0xf0);
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&(paVar5->mValue).z + lVar6) = 0;
    puVar1 = (undefined8 *)((long)&paVar5->mTime + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xf0);
  paVar3->mScalingKeys = paVar5;
  iVar4 = 0;
  for (lVar6 = 0; lVar6 != 0xf0; lVar6 = lVar6 + 0x18) {
    fVar7 = (float)iVar4;
    *(double *)((long)&paVar3->mScalingKeys->mTime + lVar6) = (double)iVar4;
    paVar5 = paVar3->mScalingKeys;
    *(float *)((long)&(paVar5->mValue).x + lVar6) = fVar7;
    *(float *)((long)&(paVar5->mValue).y + lVar6) = fVar7;
    *(float *)((long)&(paVar5->mValue).z + lVar6) = fVar7;
    iVar4 = iVar4 + 1;
  }
  ScenePreprocessorTest::ProcessAnimation(&this->super_ScenePreprocessorTest,anim);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffb0.data_,(char *)in_stack_ffffffffffffffa8.data_,
             (char *)0x38eeb2,(double)gtest_ar.message_.ptr_,
             (double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),(double)gtest_ar_.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xbc,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (((((paVar3->mNumPositionKeys != 1) ||
        (paVar5 = paVar3->mPositionKeys, paVar5 == (aiVectorKey *)0x0)) || (paVar5->mTime != 0.0))
      || ((NAN(paVar5->mTime) || (fVar7 = (paVar5->mValue).x, fVar7 != 1.0)))) ||
     ((NAN(fVar7) || ((fVar7 = (paVar5->mValue).y, fVar7 != 2.0 || (NAN(fVar7))))))) {
    gtest_ar_.success_ = false;
LAB_0038ef9e:
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)
               "anim->mNumPositionKeys == 1 && anim->mPositionKeys && anim->mPositionKeys[0].mTime == 0.0 && anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xc2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffa8);
  }
  else {
    fVar7 = (paVar5->mValue).z;
    gtest_ar_.success_ = fVar7 == 3.0;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((fVar7 != 3.0) || (NAN(fVar7))) goto LAB_0038ef9e;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  if ((paVar3->mNumRotationKeys == 1) && (paVar3->mRotationKeys != (aiQuatKey *)0x0)) {
    dVar2 = paVar3->mRotationKeys->mTime;
    gtest_ar_.success_ = dVar2 == 0.0;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_0038f0de;
  }
  else {
    gtest_ar_.success_ = false;
  }
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::Message::Message((Message *)&stack0xffffffffffffffa8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar,(internal *)&gtest_ar_,
             (AssertionResult *)
             "anim->mNumRotationKeys == 1 && anim->mRotationKeys && anim->mRotationKeys[0].mTime == 0.0"
             ,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
             ,0xc6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffa8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffffa8);
LAB_0038f0de:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  aiAnimation::~aiAnimation(anim);
  operator_delete(anim);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testAnimationPreprocessingPos) {
    aiAnimation* p = MakeDummyAnimation();
    aiNodeAnim* anim = p->mChannels[0];

    // we don't set the animation duration, but generate scaling channels
    anim->mNumScalingKeys = 10;
    anim->mScalingKeys = new aiVectorKey[10];

    for (unsigned int i = 0; i < 10;++i)    {
        anim->mScalingKeys[i].mTime = i;
        anim->mScalingKeys[i].mValue = aiVector3D((float)i);
    }
    ProcessAnimation(p);

    // we should now have a proper duration
    EXPECT_NEAR(p->mDuration, 9., 0.005);

    // ... one scaling key
    EXPECT_TRUE(anim->mNumPositionKeys == 1 &&
        anim->mPositionKeys &&
        anim->mPositionKeys[0].mTime == 0.0 &&
        anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f));

    // ... and one rotation key
    EXPECT_TRUE(anim->mNumRotationKeys == 1 && anim->mRotationKeys &&
        anim->mRotationKeys[0].mTime == 0.0);

    delete p;
}